

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void out_more_prompt(void)

{
  bool bVar1;
  os_event_info_t evt;
  int next_page;
  int done;
  os_event_info_t *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  int local_8;
  
  os_printz((char *)0x14f4e3);
  os_flush();
  bVar1 = false;
  while (!bVar1) {
    in_stack_fffffffffffffef4 =
         os_get_event(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                      in_stack_fffffffffffffef4,in_stack_fffffffffffffee8);
    if (in_stack_fffffffffffffef4 == 1) {
      if ((in_stack_fffffffffffffef8 == 10) || (in_stack_fffffffffffffef8 == 0xd)) {
        bVar1 = true;
        local_8 = 0;
      }
      else if (in_stack_fffffffffffffef8 == 0x20) {
        bVar1 = true;
        local_8 = 1;
      }
    }
    else if (in_stack_fffffffffffffef4 == 5) {
      bVar1 = true;
      local_8 = 1;
      G_os_moremode = 0;
    }
  }
  os_printz((char *)0x14f5c0);
  if (local_8 != 0) {
    G_std_disp.linecnt = 0;
  }
  return;
}

Assistant:

void out_more_prompt()
{
#ifdef USE_MORE
    /*
     *   USE_MORE defined - we take responsibility for pagination.  Show
     *   our default MORE prompt and wait for a keystroke.  
     */

    int done;
    int next_page;

    /* display the "MORE" prompt */
    os_printz("[More]");
    os_flush();

    /* wait for an acceptable keystroke */
    for (done = FALSE ; !done ; )
    {
        os_event_info_t evt;
        
        /* get an event */
        switch(os_get_event(0, FALSE, &evt))
        {
        case OS_EVT_KEY:
            switch(evt.key[0])
            {
            case ' ':
                /* stop waiting, show one page */
                done = TRUE;
                next_page = TRUE;
                break;
                
            case '\r':
            case '\n':
                /* stop waiting, show one line */
                done = TRUE;
                next_page = FALSE;
                break;

            default:
                /* ignore any other keystrokes */
                break;
            }
            break;

        case OS_EVT_EOF:
            /* end of file - there's nothing to wait for now */
            done = TRUE;
            next_page = TRUE;

            /* don't use more prompts any more, as the user can't respond */
            G_os_moremode = FALSE;
            break;

        default:
            /* ignore other events */
            break;
        }
    }

    /* 
     *   Remove the prompt from the screen by backing up and overwriting
     *   it with spaces.  (Note that this assumes that we're running in
     *   some kind of terminal or character mode with a fixed-pitch font;
     *   if that's not the case, the OS layer should be taking
     *   responsibility for pagination anyway, so this code shouldn't be
     *   in use in the first place.)  
     */
    os_printz("\r      \r");

    /* 
     *   if they pressed the space key, it means that we should show an
     *   entire new page, so reset the line count to zero; otherwise,
     *   we'll want to display another MORE prompt at the very next line,
     *   so leave the line count alone 
     */
    if (next_page)
        G_std_disp.linecnt = 0;

#else /* USE_MORE */

    /*
     *   USE_MORE is undefined - this means that the OS layer is taking
     *   all responsibility for pagination.  We must ask the OS layer to
     *   display the MORE prompt, because we can't make any assumptions
     *   about what the prompt looks like.  
     */

    os_more_prompt();

#endif /* USE_MORE */
}